

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

int __thiscall amrex::Amr::numGrids(Amr *this)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  if (-1 < (int)uVar1) {
    lVar4 = 0;
    iVar3 = 0;
    do {
      plVar2 = *(long **)((long)(this->amr_level).
                                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         + 0x120);
      iVar3 = iVar3 + (int)((ulong)(plVar2[1] - *plVar2) >> 2) * -0x49249249;
      lVar4 = lVar4 + 1;
    } while ((ulong)uVar1 + 1 != lVar4);
    return iVar3;
  }
  return 0;
}

Assistant:

int
Amr::numGrids () noexcept
{
    int cnt = 0;
    for (int i = 0; i <= finest_level; i++) {
        cnt += amr_level[i]->numGrids();
    }
    return cnt;
}